

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O0

void __thiscall hsql::CreateStatement::~CreateStatement(CreateStatement *this)

{
  vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *pvVar1;
  vector<char_*,_std::allocator<char_*>_> *pvVar2;
  bool bVar3;
  reference ppCVar4;
  reference ppcVar5;
  char *column;
  iterator __end2_1;
  iterator __begin2_1;
  vector<char_*,_std::allocator<char_*>_> *__range2_1;
  ColumnDefinition *def;
  iterator __end2;
  iterator __begin2;
  vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *__range2;
  CreateStatement *this_local;
  
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__CreateStatement_00159910;
  free(this->filePath);
  free(this->tableName);
  if (this->select != (SelectStatement *)0x0) {
    (*(this->select->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  if (this->columns !=
      (vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)0x0) {
    pvVar1 = this->columns;
    __end2 = std::vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>::begin
                       (pvVar1);
    def = (ColumnDefinition *)
          std::vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>::end
                    (pvVar1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<hsql::ColumnDefinition_**,_std::vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>_>
                                       *)&def), bVar3) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<hsql::ColumnDefinition_**,_std::vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>_>
                ::operator*(&__end2);
      if (*ppCVar4 != (ColumnDefinition *)0x0) {
        (*(*ppCVar4)->_vptr_ColumnDefinition[1])();
      }
      __gnu_cxx::
      __normal_iterator<hsql::ColumnDefinition_**,_std::vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>_>
      ::operator++(&__end2);
    }
    pvVar1 = this->columns;
    if (pvVar1 != (vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)0x0
       ) {
      std::vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>::~vector
                (pvVar1);
      operator_delete(pvVar1);
    }
  }
  if (this->viewColumns != (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    pvVar2 = this->viewColumns;
    __end2_1 = std::vector<char_*,_std::allocator<char_*>_>::begin(pvVar2);
    column = (char *)std::vector<char_*,_std::allocator<char_*>_>::end(pvVar2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                               *)&column), bVar3) {
      ppcVar5 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                ::operator*(&__end2_1);
      free(*ppcVar5);
      __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
      operator++(&__end2_1);
    }
    pvVar2 = this->viewColumns;
    if (pvVar2 != (vector<char_*,_std::allocator<char_*>_> *)0x0) {
      std::vector<char_*,_std::allocator<char_*>_>::~vector(pvVar2);
      operator_delete(pvVar2);
    }
  }
  SQLStatement::~SQLStatement(&this->super_SQLStatement);
  return;
}

Assistant:

CreateStatement::~CreateStatement() {
    free(filePath);
    free(tableName);
    delete select;

    if (columns != NULL) {
      for (ColumnDefinition* def : *columns) {
        delete def;
      }
      delete columns;
    }

    if (viewColumns != NULL) {
      for (char* column : *viewColumns) {
        free(column);
      }
      delete viewColumns;
    }
  }